

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonConstFuncs.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::PastFunc::checkArguments
          (PastFunc *this,ASTContext *context,Args *args,SourceRange range,Expression *param_5)

{
  SourceRange sourceRange;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  ASTContext *pAVar2;
  size_type sVar3;
  reference ppEVar4;
  int *piVar5;
  Type *pTVar6;
  SourceLocation in_RCX;
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> *in_RDX;
  SourceLocation in_RSI;
  SourceLocation in_R8;
  Expression *in_stack_00000038;
  ASTContext *in_stack_00000040;
  bitmask<slang::ast::EvalFlags> in_stack_0000004f;
  optional<int> numTicks;
  size_t i;
  Compilation *comp;
  ASTContext *in_stack_ffffffffffffff48;
  ASTContext *in_stack_ffffffffffffff50;
  SourceLocation SVar7;
  Expression *in_stack_ffffffffffffff58;
  element_type in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 uVar8;
  undefined2 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff92;
  undefined2 in_stack_ffffffffffffff96;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  SystemSubroutine *in_stack_ffffffffffffffa8;
  ASTContext *context_00;
  ASTContext *__idx;
  Type *local_8;
  
  uVar8 = (undefined1)((ulong)in_stack_ffffffffffffff98 >> 0x38);
  this_00 = ASTContext::getCompilation((ASTContext *)0x991c91);
  callRange.endLoc = in_R8;
  callRange.startLoc = in_RCX;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_stack_ffffffffffffffa8,
                     (ASTContext *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (bool)uVar8,
                     (Args *)CONCAT26(in_stack_ffffffffffffff96,
                                      CONCAT42(in_stack_ffffffffffffff92,in_stack_ffffffffffffff90))
                     ,callRange,(size_t)in_RDX,(size_t)in_RSI);
  if (bVar1) {
    context_00 = (ASTContext *)0x0;
    while( true ) {
      __idx = context_00;
      pAVar2 = (ASTContext *)
               std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                         ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                          0x991d3a);
      uVar8 = context_00 < pAVar2 && __idx < (ASTContext *)0x3;
      if (context_00 >= pAVar2 || __idx >= (ASTContext *)0x3) break;
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                (in_RDX,(size_type)__idx);
      AssertionExpr::checkSampledValueExpr
                (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0),
                 SUB84((ulong)in_stack_ffffffffffffff60 >> 0x20,0),
                 SUB84(in_stack_ffffffffffffff60,0));
      context_00 = (ASTContext *)((long)&(__idx->scope).ptr + 1);
    }
    sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x991dd1
                      );
    if ((1 < sVar3) &&
       (ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (in_RDX,1), (*ppEVar4)->kind != EmptyArgument)) {
      SVar7 = in_RSI;
      ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                          (in_RDX,1);
      in_stack_ffffffffffffff60 = *ppEVar4;
      memset(&stack0xffffffffffffff97,0,1);
      bitmask<slang::ast::EvalFlags>::bitmask
                ((bitmask<slang::ast::EvalFlags> *)&stack0xffffffffffffff97);
      ASTContext::evalInteger(in_stack_00000040,in_stack_00000038,in_stack_0000004f);
      bVar1 = std::optional::operator_cast_to_bool((optional<int> *)0x991e5e);
      if ((bVar1) &&
         (piVar5 = std::optional<int>::operator*((optional<int> *)0x991e6e), *piVar5 < 1)) {
        std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,1)
        ;
        sourceRange.endLoc = in_RSI;
        sourceRange.startLoc = SVar7;
        ASTContext::addDiag(in_stack_ffffffffffffff48,
                            SUB84((ulong)in_stack_ffffffffffffff60 >> 0x20,0),sourceRange);
      }
    }
    sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x991ed8
                      );
    if ((2 < sVar3) &&
       (ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (in_RDX,2), (*ppEVar4)->kind != EmptyArgument)) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,2);
      bVar1 = ASTContext::requireBooleanConvertible((ASTContext *)in_R8,(Expression *)in_RCX);
      if (!bVar1) {
        pTVar6 = Compilation::getErrorType(this_00);
        return pTVar6;
      }
    }
    sVar3 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::size
                      ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)0x991f51
                      );
    if ((sVar3 < 4) ||
       (ppEVar4 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            (in_RDX,3), (*ppEVar4)->kind == ClockingEvent)) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,0);
      local_8 = not_null<const_slang::ast::Type_*>::operator*
                          ((not_null<const_slang::ast::Type_*> *)0x991fc9);
    }
    else {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[](in_RDX,3);
      local_8 = SystemSubroutine::badArg
                          ((SystemSubroutine *)CONCAT17(uVar8,in_stack_ffffffffffffff70),context_00,
                           in_stack_ffffffffffffff60);
    }
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, 1, 4))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size() && i < 3; i++) {
            AssertionExpr::checkSampledValueExpr(*args[i], context, false,
                                                 diag::SampledValueLocalVar,
                                                 diag::SampledValueMatched);
        }

        if (args.size() > 1 && args[1]->kind != ExpressionKind::EmptyArgument) {
            auto numTicks = context.evalInteger(*args[1]);
            if (numTicks && *numTicks < 1)
                context.addDiag(diag::PastNumTicksInvalid, args[1]->sourceRange);
        }

        if (args.size() > 2 && args[2]->kind != ExpressionKind::EmptyArgument) {
            if (!context.requireBooleanConvertible(*args[2]))
                return comp.getErrorType();
        }

        if (args.size() > 3 && args[3]->kind != ExpressionKind::ClockingEvent)
            return badArg(context, *args[3]);

        return *args[0]->type;
    }